

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_bind.c
# Opt level: O2

int socket_conv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  mpt_type_t mVar3;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    mVar3 = 0x100;
  }
  else {
    mVar3 = pmVar2->type;
    if (mVar3 == type) goto LAB_00106140;
  }
  iVar1 = (int)mVar3;
  if (type != 0x100) {
    if (type == 1) {
      if (ptr == (void *)0x0) {
        return iVar1;
      }
      *(undefined4 *)ptr = *(undefined4 *)&val[1]._vptr;
      return iVar1;
    }
    if (type == 0) {
      if (ptr == (void *)0x0) {
        return iVar1;
      }
      *(char **)ptr = "\x01";
      return iVar1;
    }
    return -3;
  }
LAB_00106140:
  if (ptr != (void *)0x0) {
    *(mpt_convertable **)ptr = val;
  }
  return 1;
}

Assistant:

static int socket_conv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	struct socketInput *sd = (void *) val;
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeUnixSocket), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = &sd->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((MPT_STRUCT(socket) *) ptr) = sd->sock;
		return me;
	}
	return MPT_ERROR(BadType);
}